

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeT2CPSInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = Insn >> 9 & 3;
  if (uVar4 == 1) {
    return MCDisassembler_Fail;
  }
  uVar3 = Insn >> 5 & 7;
  uVar2 = Insn & 0x1f;
  if ((Insn >> 8 & 1) == 0 || uVar4 == 0) {
    if (uVar4 == 0 || (Insn >> 8 & 1) != 0) {
      if ((Insn >> 8 & 1) == 0 || uVar4 != 0) {
        uVar2 = Insn & 0xff;
        if (4 < uVar2) {
          return MCDisassembler_Fail;
        }
        MCInst_setOpcode(Inst,0x928);
        goto LAB_001cc48f;
      }
      MCInst_setOpcode(Inst,0x916);
      MCOperand_CreateImm0(Inst,(ulong)uVar2);
      uVar2 = uVar3;
    }
    else {
      MCInst_setOpcode(Inst,0x917);
      MCOperand_CreateImm0(Inst,(ulong)uVar4);
      MCOperand_CreateImm0(Inst,(ulong)uVar3);
    }
    DVar1 = (uint)(uVar2 == 0) * 2 + MCDisassembler_SoftFail;
  }
  else {
    MCInst_setOpcode(Inst,0x918);
    MCOperand_CreateImm0(Inst,(ulong)uVar4);
    MCOperand_CreateImm0(Inst,(ulong)uVar3);
LAB_001cc48f:
    MCOperand_CreateImm0(Inst,(ulong)uVar2);
    DVar1 = MCDisassembler_Success;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeT2CPSInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	unsigned imod = fieldFromInstruction_4(Insn, 9, 2);
	unsigned M = fieldFromInstruction_4(Insn, 8, 1);
	unsigned iflags = fieldFromInstruction_4(Insn, 5, 3);
	unsigned mode = fieldFromInstruction_4(Insn, 0, 5);

	DecodeStatus S = MCDisassembler_Success;

	// imod == '01' --> UNPREDICTABLE
	// NOTE: Even though this is technically UNPREDICTABLE, we choose to
	// return failure here.  The '01' imod value is unprintable, so there's
	// nothing useful we could do even if we returned UNPREDICTABLE.

	if (imod == 1) return MCDisassembler_Fail;

	if (imod && M) {
		MCInst_setOpcode(Inst, ARM_t2CPS3p);
		MCOperand_CreateImm0(Inst, imod);
		MCOperand_CreateImm0(Inst, iflags);
		MCOperand_CreateImm0(Inst, mode);
	} else if (imod && !M) {
		MCInst_setOpcode(Inst, ARM_t2CPS2p);
		MCOperand_CreateImm0(Inst, imod);
		MCOperand_CreateImm0(Inst, iflags);
		if (mode) S = MCDisassembler_SoftFail;
	} else if (!imod && M) {
		MCInst_setOpcode(Inst, ARM_t2CPS1p);
		MCOperand_CreateImm0(Inst, mode);
		if (iflags) S = MCDisassembler_SoftFail;
	} else {
		// imod == '00' && M == '0' --> this is a HINT instruction
		int imm = fieldFromInstruction_4(Insn, 0, 8);
		// HINT are defined only for immediate in [0..4]
		if(imm > 4) return MCDisassembler_Fail;
		MCInst_setOpcode(Inst, ARM_t2HINT);
		MCOperand_CreateImm0(Inst, imm);
	}

	return S;
}